

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::CoverCrossSyntax::setChild(CoverCrossSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_002571fc + *(int *)(&DAT_002571fc + index * 4)))();
  return;
}

Assistant:

void CoverCrossSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: label = child.node() ? &child.node()->as<NamedLabelSyntax>() : nullptr; return;
        case 2: cross = child.token(); return;
        case 3: items = child.node()->as<SeparatedSyntaxList<IdentifierNameSyntax>>(); return;
        case 4: iff = child.node() ? &child.node()->as<CoverageIffClauseSyntax>() : nullptr; return;
        case 5: openBrace = child.token(); return;
        case 6: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 7: closeBrace = child.token(); return;
        case 8: emptySemi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}